

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod_inv.c
# Opt level: O0

int32 mod_inv_read_mixw(model_inventory_t *minv,model_def_t *mdef,char *fn,float32 floor)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  undefined8 in_stack_ffffffffffffff98;
  char *pcVar4;
  undefined4 uVar5;
  uint local_5c;
  uint32 err;
  uint32 n_err_norm;
  uint32 *err_norm;
  uint local_48;
  uint32 n_density;
  uint32 j;
  uint32 n_feat;
  uint32 i;
  uint32 n_mixw;
  float32 ***mixw;
  char *pcStack_28;
  float32 floor_local;
  char *fn_local;
  model_def_t *mdef_local;
  model_inventory_t *minv_local;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  mixw._4_4_ = floor;
  pcStack_28 = fn;
  fn_local = (char *)mdef;
  mdef_local = (model_def_t *)minv;
  iVar2 = s3mixw_read(fn,(float32 ****)&i,&n_feat,&n_density,(uint32 *)((long)&err_norm + 4));
  if (iVar2 == 0) {
    *(float32 ****)&mdef_local->n_defn = _i;
    *(uint32 *)&mdef_local->cb = n_feat;
    if (n_feat != *(uint32 *)(fn_local + 0x1c)) {
      pcVar4 = pcStack_28;
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x161,
              "Number of tied states in mdef file %u differs from the number of mixtures %u in %s, do files belong to the same model?\n"
              ,(ulong)*(uint *)(fn_local + 0x1c),(ulong)n_feat,pcStack_28);
      uVar5 = (undefined4)((ulong)pcVar4 >> 0x20);
    }
    if ((*(int *)((long)&mdef_local->cb + 4) != 0) &&
       (n_density != *(uint32 *)((long)&mdef_local->cb + 4))) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x166,
              "Number of feature streams in mixture_weights file %u differs from the configured value %u, check the command line options\n"
              ,(ulong)n_density,(ulong)*(uint *)((long)&mdef_local->cb + 4));
      exit(1);
    }
    if (*(int *)((long)&mdef_local->cb + 4) == 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x16a,
              "Number of feature streams in the model inventory is not set; setting to the value in mixture_weights file, %u.\n"
              ,(ulong)n_density);
      *(uint32 *)((long)&mdef_local->cb + 4) = n_density;
    }
    if ((mdef_local->n_cb == 0) || (err_norm._4_4_ == mdef_local->n_cb)) {
      if (mdef_local->n_cb == 0) {
        mdef_local->n_cb = err_norm._4_4_;
      }
    }
    else {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x171,
              "Number of densities per mixture, %u in %s differs from the configured value %u\n, check the command line options"
              ,(ulong)err_norm._4_4_,pcStack_28,CONCAT44(uVar5,mdef_local->n_cb));
    }
    if (((float)mixw._4_4_ != 0.0) || (NAN((float)mixw._4_4_))) {
      _err = (void *)0x0;
      local_5c = 0;
      bVar1 = false;
      for (j = 0; j < n_feat; j = j + 1) {
        for (local_48 = 0; local_48 < n_density; local_48 = local_48 + 1) {
          iVar3 = vector_normalize((vector_t)_i[j][local_48],err_norm._4_4_);
          if (iVar3 != 0) {
            bVar1 = true;
          }
          vector_floor((vector_t)_i[j][local_48],err_norm._4_4_,mixw._4_4_);
          vector_normalize((vector_t)_i[j][local_48],err_norm._4_4_);
        }
        if (bVar1) {
          if (_err == (void *)0x0) {
            _err = __ckd_calloc__((ulong)n_feat,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                                  ,399);
            *(uint32 *)((long)_err + (ulong)local_5c * 4) = j;
          }
          else {
            *(uint32 *)((long)_err + (ulong)local_5c * 4) = j;
          }
          local_5c = local_5c + 1;
          bVar1 = false;
        }
      }
      if (local_5c != 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                ,0x198,"Failed to norm for %d mixw:",(ulong)local_5c);
        for (j = 0; j < local_5c; j = j + 1) {
          err_msg(ERR_INFOCONT,(char *)0x0,0," %u",(ulong)*(uint *)((long)_err + (ulong)j * 4));
        }
        err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
        ckd_free(_err);
      }
    }
    minv_local._4_4_ = 0;
  }
  else {
    minv_local._4_4_ = -1;
  }
  return minv_local._4_4_;
}

Assistant:

int32
mod_inv_read_mixw(model_inventory_t *minv,
		  const model_def_t *mdef,
		  const char *fn,
		  float32 floor)
{
    float32 ***mixw;
    uint32 n_mixw, i;
    uint32 n_feat, j;
    uint32 n_density;

    if (s3mixw_read(fn,
		    &mixw,
		    &n_mixw,
		    &n_feat,
		    &n_density) != S3_SUCCESS) {
	return S3_ERROR;
    }
    minv->mixw = mixw;
    minv->n_mixw = n_mixw;

    if (n_mixw != mdef->n_tied_state) {
	E_WARN("Number of tied states in mdef file %u differs from the number of mixtures %u in %s, do files belong to the same model?\n",
	       mdef->n_tied_state, n_mixw, fn);
    }

    if ((minv->n_feat > 0) && (n_feat != minv->n_feat)) {
	E_FATAL("Number of feature streams in mixture_weights file %u differs from the configured value %u, check the command line options\n",
		n_feat, minv->n_feat);
    }
    else if (minv->n_feat == 0) {
	E_WARN("Number of feature streams in the model inventory is not set; setting to the value in mixture_weights file, %u.\n",
	       n_feat);

	minv->n_feat = n_feat;
    }

    if ((minv->n_density > 0) && (n_density != minv->n_density)) {
	E_WARN("Number of densities per mixture, %u in %s differs from the configured value %u\n, check the command line options",
	       n_density, fn, minv->n_density);
    }
    else if (minv->n_density == 0) {
	/* This warning is bogus. */
        /* E_WARN("Model inventory n_density not set; setting to value in mixw file, %u.\n",
	   n_density); */

	minv->n_density = n_density;
    }

    if (floor != 0) {
	uint32 *err_norm = NULL;
	uint32 n_err_norm = 0;
	uint32 err = FALSE;

	for (i = 0; i < n_mixw; i++) {
	    for (j = 0; j < n_feat; j++) {
		if (vector_normalize(mixw[i][j], n_density) != S3_SUCCESS) {
		    err = TRUE;
		}
		vector_floor(mixw[i][j], n_density, floor);
		vector_normalize(mixw[i][j], n_density);
	    }

	    if (err) {
		if (err_norm) {
		    err_norm[n_err_norm++] = i;
		}
		else {
		    /* first use; allocate it */
		    err_norm = ckd_calloc(n_mixw, sizeof(uint32));
		    err_norm[n_err_norm++] = i;
		}

		err = FALSE;
	    }
	}

	if (n_err_norm > 0) {
	    E_INFO("Failed to norm for %d mixw:", n_err_norm);
	    for (i = 0; i < n_err_norm; i++) {
		E_INFOCONT(" %u", err_norm[i]);
	    }
	    E_INFOCONT("\n");

	    ckd_free(err_norm);
	}
    }

    return S3_SUCCESS;
}